

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O2

size_t webrtc::WriteFloatBufferToFile(FileWrapper *file,size_t length,float *buffer)

{
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uVar1;
  int iVar2;
  size_t sVar3;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> byte_array;
  
  if (file == (FileWrapper *)0x0) {
    sVar3 = 0;
  }
  else {
    iVar2 = (*(file->super_InStream)._vptr_InStream[4])();
    sVar3 = 0;
    if (((length != 0) && (buffer != (float *)0x0)) && ((char)iVar2 != '\0')) {
      byte_array._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           operator_new__(4);
      for (sVar3 = 0;
          uVar1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
          _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               byte_array._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl, length != sVar3;
          sVar3 = sVar3 + 1) {
        ConvertFloatToByteArray
                  (buffer[sVar3],
                   (uint8_t *)
                   byte_array._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
        (**(file->super_OutStream)._vptr_OutStream)
                  (&file->super_OutStream,
                   uVar1._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,4);
      }
      (*(file->super_InStream)._vptr_InStream[9])();
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&byte_array);
      sVar3 = length;
    }
  }
  return sVar3;
}

Assistant:

size_t WriteFloatBufferToFile(FileWrapper* file,
                              size_t length,
                              const float* buffer) {
  if (!file || !file->Open() || !buffer || length <= 0) {
    return 0;
  }

  std::unique_ptr<uint8_t[]> byte_array(new uint8_t[4]);

  size_t floats_written = 0;

  for (floats_written = 0; floats_written < length; ++floats_written) {
    // Get byte representation.
    ConvertFloatToByteArray(buffer[floats_written], byte_array.get());

    file->Write(byte_array.get(), 4);
  }

  file->Flush();

  return floats_written;
}